

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

void composition_destination_out(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  uint32_t uVar1;
  int local_30;
  uint32_t sia;
  int i_1;
  uint32_t cia;
  int i;
  uint32_t const_alpha_local;
  uint32_t *src_local;
  int length_local;
  uint32_t *dest_local;
  
  if (const_alpha == 0xff) {
    for (i_1 = 0; i_1 < length; i_1 = i_1 + 1) {
      uVar1 = BYTE_MUL(dest[i_1],(src[i_1] ^ 0xffffffff) >> 0x18);
      dest[i_1] = uVar1;
    }
  }
  else {
    for (local_30 = 0; local_30 < length; local_30 = local_30 + 1) {
      uVar1 = BYTE_MUL((src[local_30] ^ 0xffffffff) >> 0x18,const_alpha);
      uVar1 = BYTE_MUL(dest[local_30],uVar1 + (0xff - const_alpha));
      dest[local_30] = uVar1;
    }
  }
  return;
}

Assistant:

static void composition_destination_out(uint32_t* dest, int length, const uint32_t* src, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        for(int i = 0; i < length; i++) {
            dest[i] = BYTE_MUL(dest[i], plutovg_alpha(~src[i]));
        }
    } else {
        uint32_t cia = 255 - const_alpha;
        for(int i = 0; i < length; i++) {
            uint32_t sia = BYTE_MUL(plutovg_alpha(~src[i]), const_alpha) + cia;
            dest[i] = BYTE_MUL(dest[i], sia);
        }
    }
}